

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O3

void __thiscall fasttext::Args::printAutotuneHelp(Args *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\nThe following arguments are for autotune:\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "  -autotune-validation            validation file to be used for evaluation\n",0x4c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "  -autotune-metric                metric objective {f1, f1:labelname} [",0x47);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(this->autotuneMetric)._M_dataplus._M_p,
                      (this->autotuneMetric)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"  -autotune-predictions           number of predictions used for evaluation  ["
             ,0x4e);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->autotunePredictions);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"  -autotune-duration              maximum duration in seconds [",0x3f);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->autotuneDuration);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"  -autotune-modelsize             constraint model file size [",0x3e);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->autotuneModelSize)._M_dataplus._M_p,
                      (this->autotuneModelSize)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] (empty = do not quantize)\n",0x1c);
  return;
}

Assistant:

void Args::printAutotuneHelp() {
  std::cerr << "\nThe following arguments are for autotune:\n"
            << "  -autotune-validation            validation file to be used "
               "for evaluation\n"
            << "  -autotune-metric                metric objective {f1, "
               "f1:labelname} ["
            << autotuneMetric << "]\n"
            << "  -autotune-predictions           number of predictions used "
               "for evaluation  ["
            << autotunePredictions << "]\n"
            << "  -autotune-duration              maximum duration in seconds ["
            << autotuneDuration << "]\n"
            << "  -autotune-modelsize             constraint model file size ["
            << autotuneModelSize << "] (empty = do not quantize)\n";
}